

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O2

LINK_HANDLE
create_link(role link_role,SESSION_HANDLE session_handle,AMQP_MESSENGER_LINK_CONFIG *link_config,
           char *iothub_host_fqdn,char *device_id,char *module_id)

{
  MAP_HANDLE handle;
  bool bVar1;
  int iVar2;
  UNIQUEID_RESULT UVar3;
  MAP_RESULT MVar4;
  STRING_HANDLE handle_00;
  LOGGER_LOG p_Var5;
  STRING_HANDLE handle_01;
  STRING_HANDLE handle_02;
  STRING_HANDLE handle_03;
  SESSION_HANDLE value;
  AMQP_VALUE target;
  LINK_HANDLE link;
  AMQP_VALUE attach_properties;
  AMQP_VALUE key;
  AMQP_VALUE value_00;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  STRING_HANDLE local_68;
  char **keys;
  SESSION_HANDLE local_50;
  STRING_HANDLE local_48;
  ulong local_40;
  char **values;
  
  pcVar8 = (&link_config->source_suffix)[!link_role];
  local_50 = session_handle;
  handle_00 = STRING_new();
  if (handle_00 == (STRING_HANDLE)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_link_address",0x129,1,"failed creating link_address (STRING_new failed)");
    }
    goto LAB_0013c775;
  }
  if (module_id == (char *)0x0) {
    iVar2 = STRING_sprintf(handle_00,"amqps://%s/devices/%s/%s",iothub_host_fqdn,device_id,pcVar8);
    if (iVar2 == 0) goto LAB_0013c7b7;
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar8 = "Failed creating the link_address (STRING_sprintf failed)";
      iVar2 = 0x13a;
      goto LAB_0013c766;
    }
  }
  else {
    iVar2 = STRING_sprintf(handle_00,"amqps://%s/devices/%s/modules/%s/%s",iothub_host_fqdn,
                           device_id,module_id,pcVar8);
    if (iVar2 == 0) {
LAB_0013c7b7:
      pcVar8 = (char *)calloc(1,0x26);
      if (pcVar8 == (char *)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"create_link_name",0x163,1,
                    "Failed generating an unique tag (calloc failed), size:%zu",0x26);
        }
      }
      else {
        UVar3 = UniqueId_Generate(pcVar8,0x25);
        if (UVar3 == UNIQUEID_OK) {
          handle_01 = STRING_new();
          if (handle_01 == (STRING_HANDLE)0x0) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              pcVar6 = "Failed generating an unique tag (STRING_new failed)";
              iVar2 = 0x16f;
              goto LAB_0013c90b;
            }
          }
          else {
            pcVar6 = "link-snd";
            if (link_role) {
              pcVar6 = "link-rcv";
            }
            iVar2 = STRING_sprintf(handle_01,"%s-%s-%s",pcVar6,device_id,pcVar8);
            if (iVar2 == 0) goto LAB_0013c915;
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                        ,"create_link_name",0x173,1,
                        "Failed generating an unique tag (STRING_sprintf failed)");
            }
            STRING_delete(handle_01);
          }
LAB_0013c912:
          handle_01 = (STRING_HANDLE)0x0;
        }
        else {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0013c912;
          pcVar6 = "Failed generating an unique tag (UniqueId_Generate failed)";
          iVar2 = 0x16a;
LAB_0013c90b:
          handle_01 = (STRING_HANDLE)0x0;
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"create_link_name",iVar2,1,pcVar6);
        }
LAB_0013c915:
        free(pcVar8);
        if (handle_01 != (STRING_HANDLE)0x0) {
          if (link_role) {
            handle_02 = create_link_terminus_name(handle_01,"target");
            handle_03 = handle_00;
            local_68 = handle_02;
            if (handle_02 == (STRING_HANDLE)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                iVar2 = 499;
LAB_0013ca7c:
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                          ,"create_link_terminus",iVar2,1,"Failed creating terminus name");
              }
              goto LAB_0013ca8c;
            }
LAB_0013c9b5:
            pcVar8 = STRING_c_str(handle_03);
            pcVar6 = STRING_c_str(handle_02);
            if (pcVar6 == (char *)0x0 || pcVar8 == (char *)0x0) goto LAB_0013ca92;
            value = (SESSION_HANDLE)messaging_create_source(pcVar8);
            if (value == (SESSION_HANDLE)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0013cb45;
              pcVar8 = "Failed creating link source";
              iVar2 = 0x207;
              goto LAB_0013cacf;
            }
            target = messaging_create_target(pcVar6);
            if (target == (AMQP_VALUE)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                          ,"create_link_terminus",0x20e,1,"Failed creating link target");
              }
              amqpvalue_destroy((AMQP_VALUE)value);
              goto LAB_0013cb45;
            }
            bVar1 = true;
          }
          else {
            handle_03 = create_link_terminus_name(handle_01,"source");
            handle_02 = handle_00;
            local_68 = handle_03;
            if (handle_03 != (STRING_HANDLE)0x0) goto LAB_0013c9b5;
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              iVar2 = 0x1e5;
              goto LAB_0013ca7c;
            }
LAB_0013ca8c:
            local_68 = (STRING_HANDLE)0x0;
LAB_0013ca92:
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              pcVar8 = "Failed creating link source and/or target name (source=%p, target=%p)";
              iVar2 = 0x200;
LAB_0013cacf:
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                        ,"create_link_terminus",iVar2,1,pcVar8);
            }
LAB_0013cb45:
            value = (SESSION_HANDLE)0x0;
            target = (AMQP_VALUE)0x0;
            bVar1 = false;
          }
          STRING_delete(local_68);
          local_48 = handle_01;
          if (bVar1) {
            pcVar8 = STRING_c_str(handle_01);
            link = link_create(local_50,pcVar8,link_role,(AMQP_VALUE)value,target);
            if (link == (LINK_HANDLE)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0013ce72;
              link = (LINK_HANDLE)0x0;
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                        ,"create_link",0x23c,1,"Failed creating the AMQP link");
            }
            else {
              iVar2 = link_set_max_message_size(link,0xffffffffffffffff);
              if ((iVar2 != 0) && (p_Var5 = xlogging_get_log_function(), p_Var5 != (LOGGER_LOG)0x0))
              {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                          ,"create_link",0x242,1,"Failed setting link max message size.");
              }
              handle = link_config->attach_properties;
              if (handle != (MAP_HANDLE)0x0) {
                attach_properties = amqpvalue_create_map();
                if (attach_properties == (AMQP_VALUE)0x0) {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 != (LOGGER_LOG)0x0) {
                    (*p_Var5)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                              ,"add_link_attach_properties",0x193,1,
                              "Failed to create the map for attach properties.");
                  }
                }
                else {
                  MVar4 = Map_GetInternals(handle,&keys,&values,&local_40);
                  if (MVar4 == MAP_OK) {
                    iVar2 = 0;
                    local_50 = value;
                    for (uVar7 = 0; (value = local_50, iVar2 == 0 && (uVar7 < local_40));
                        uVar7 = uVar7 + 1) {
                      key = amqpvalue_create_symbol(keys[uVar7]);
                      if (key == (AMQP_VALUE)0x0) {
                        p_Var5 = xlogging_get_log_function();
                        iVar2 = 0x1ae;
                        if (p_Var5 != (LOGGER_LOG)0x0) {
                          (*p_Var5)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                                    ,"add_link_attach_properties",0x1ad,1,
                                    "Failed creating AMQP_VALUE For key %s.",keys[uVar7]);
                        }
                      }
                      else {
                        value_00 = amqpvalue_create_string(values[uVar7]);
                        if (value_00 == (AMQP_VALUE)0x0) {
                          p_Var5 = xlogging_get_log_function();
                          iVar2 = 0x1b5;
                          if (p_Var5 != (LOGGER_LOG)0x0) {
                            (*p_Var5)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                                      ,"add_link_attach_properties",0x1b4,1,
                                      "Failed creating AMQP_VALUE For key %s value",keys[uVar7]);
                          }
                        }
                        else {
                          iVar2 = amqpvalue_set_map_value(attach_properties,key,value_00);
                          if (iVar2 == 0) {
                            iVar2 = 0;
                          }
                          else {
                            p_Var5 = xlogging_get_log_function();
                            iVar2 = 0x1bc;
                            if (p_Var5 != (LOGGER_LOG)0x0) {
                              (*p_Var5)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                                        ,"add_link_attach_properties",0x1bb,1,
                                        "Failed adding property %s to map",keys[uVar7]);
                            }
                          }
                          amqpvalue_destroy(value_00);
                        }
                        amqpvalue_destroy(key);
                      }
                    }
                    if (iVar2 == 0) {
                      iVar2 = link_set_attach_properties(link,attach_properties);
                      if (iVar2 == 0) {
                        amqpvalue_destroy(attach_properties);
                        goto LAB_0013ce75;
                      }
                      p_Var5 = xlogging_get_log_function();
                      if (p_Var5 != (LOGGER_LOG)0x0) {
                        pcVar8 = "Failed attaching properties to link";
                        iVar2 = 0x1ca;
                        goto LAB_0013ce1a;
                      }
                    }
                  }
                  else {
                    p_Var5 = xlogging_get_log_function();
                    if (p_Var5 != (LOGGER_LOG)0x0) {
                      pcVar8 = "failed getting user defined properties details.";
                      iVar2 = 0x19e;
LAB_0013ce1a:
                      (*p_Var5)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                                ,"add_link_attach_properties",iVar2,1,pcVar8);
                    }
                  }
                  amqpvalue_destroy(attach_properties);
                }
                p_Var5 = xlogging_get_log_function();
                if (p_Var5 != (LOGGER_LOG)0x0) {
                  (*p_Var5)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                            ,"create_link",0x248,1,"Failed setting link attach properties");
                }
                link_destroy(link);
LAB_0013ce72:
                link = (LINK_HANDLE)0x0;
              }
            }
LAB_0013ce75:
            amqpvalue_destroy((AMQP_VALUE)value);
            amqpvalue_destroy(target);
          }
          else {
            link = (LINK_HANDLE)0x0;
          }
          STRING_delete(local_48);
          goto LAB_0013ce8f;
        }
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) {
        link = (LINK_HANDLE)0x0;
      }
      else {
        link = (LINK_HANDLE)0x0;
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"create_link",0x230,1,"Failed creating the link name");
      }
LAB_0013ce8f:
      STRING_delete(handle_00);
      return link;
    }
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar8 = "Failed creating the link_address for a module (STRING_sprintf failed)";
      iVar2 = 0x131;
LAB_0013c766:
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                ,"create_link_address",iVar2,1,pcVar8);
    }
  }
  STRING_delete(handle_00);
LAB_0013c775:
  p_Var5 = xlogging_get_log_function();
  if (p_Var5 != (LOGGER_LOG)0x0) {
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
              ,"create_link",0x227,1,
              "Failed creating the message sender (failed creating the \'link_address\')");
  }
  return (LINK_HANDLE)0x0;
}

Assistant:

static LINK_HANDLE create_link(role link_role, SESSION_HANDLE session_handle, AMQP_MESSENGER_LINK_CONFIG* link_config, const char* iothub_host_fqdn, const char* device_id, const char* module_id)
{
    LINK_HANDLE result = NULL;
    STRING_HANDLE link_address;

    if ((link_address = create_link_address(iothub_host_fqdn, device_id, module_id, (link_role == role_sender ? link_config->target_suffix : link_config->source_suffix))) == NULL)
    {
        LogError("Failed creating the message sender (failed creating the 'link_address')");
        result = NULL;
    }
    else
    {
        STRING_HANDLE link_name;

        if ((link_name = create_link_name(link_role, device_id)) == NULL)
        {
            LogError("Failed creating the link name");
            result = NULL;
        }
        else
        {
            AMQP_VALUE source = NULL;
            AMQP_VALUE target = NULL;

            if (create_link_terminus(link_role, link_name, link_address, &source, &target) == RESULT_OK)
            {
                if ((result = link_create(session_handle, STRING_c_str(link_name), link_role, source, target)) == NULL)
                {
                    LogError("Failed creating the AMQP link");
                }
                else
                {
                    if (link_set_max_message_size(result, MESSAGE_SENDER_MAX_LINK_SIZE) != RESULT_OK)
                    {
                        LogError("Failed setting link max message size.");
                    }

                    if (link_config->attach_properties != NULL &&
                        add_link_attach_properties(result, link_config->attach_properties) != RESULT_OK)
                    {
                        LogError("Failed setting link attach properties");
                        link_destroy(result);
                        result = NULL;
                    }
                }

                amqpvalue_destroy(source);
                amqpvalue_destroy(target);
            }

            STRING_delete(link_name);
        }

        STRING_delete(link_address);
    }

    return result;
}